

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O3

int main(void)

{
  ostringstream *poVar1;
  ostringstream *this;
  long lVar2;
  bool bVar3;
  SDKResult result;
  OutputWorker *pOVar4;
  long *plVar5;
  size_t sVar6;
  char *pcVar7;
  char *__end;
  uint8_t ping [5];
  string line;
  char cline [512];
  MyClient client;
  undefined4 local_510;
  undefined1 local_50c;
  undefined1 *local_508;
  long local_500;
  undefined1 local_4f8 [16];
  char *local_4e8;
  long local_4e0;
  char local_4d8 [16];
  undefined1 local_4c8 [512];
  undefined1 local_2c8 [392];
  MyClient local_140;
  
  tonk::SDKSocket::SDKSocket(&local_140.super_SDKSocket);
  local_140.super_SDKSocket._vptr_SDKSocket = (_func_int **)&PTR__MyClient_0010fa80;
  local_140.StartedP2PConnection = false;
  local_140.ClientList.ConnectionListLock.super___mutex_base._M_mutex.__align = 0;
  local_140.ClientList.ConnectionListLock.super___mutex_base._M_mutex._8_8_ = 0;
  local_140.ClientList.ConnectionListLock.super___mutex_base._M_mutex._16_8_ = 0;
  local_140.ClientList.ConnectionListLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_140.ClientList.ConnectionListLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_140.ClientList.ConnectionList.
  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.ClientList.ConnectionList.
  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.ClientList.ConnectionList.
  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.P2PClientList.ConnectionListLock.super___mutex_base._M_mutex.__align = 0;
  local_140.P2PClientList.ConnectionListLock.super___mutex_base._M_mutex._8_8_ = 0;
  local_140.P2PClientList.ConnectionListLock.super___mutex_base._M_mutex._16_8_ = 0;
  local_140.P2PClientList.ConnectionListLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_140.P2PClientList.ConnectionListLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_140.P2PClientList.ConnectionList.
  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.P2PClientList.ConnectionList.
  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.P2PClientList.ConnectionList.
  super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = MyClient::Initialize(&local_140);
  if (bVar3) {
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = (ostringstream *)(local_4c8 + 0x10);
      local_4c8._0_8_ = Logger.ChannelName;
      local_4c8._8_4_ = Debug;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Press SPACE key to stop server. Any other key will send an advertisement broadcast"
                 ,0x52);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_4c8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x80));
    }
    poVar1 = (ostringstream *)(local_2c8 + 0x10);
    this = (ostringstream *)(local_2c8 + 0x10);
    do {
      std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '8');
      plVar5 = (long *)std::istream::getline((char *)&std::cin,(long)local_4c8,'\0');
      if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
      local_508 = local_4f8;
      sVar6 = strlen(local_4c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_508,local_4c8,local_4c8 + sVar6);
      lVar2 = local_500;
      if (local_500 != 0) {
        local_2c8._0_8_ = local_2c8 + 0x10;
        local_50c = 4;
        local_510 = 0x3020164;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"");
        result = tonk::SDKSocket::Advertise
                           (&local_140.super_SDKSocket,(string *)local_2c8,0x13c4,&local_510,5);
        if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
          operator_delete((void *)local_2c8._0_8_);
        }
        if (result.Result == Tonk_Success) {
          if ((int)Logger.ChannelMinLevel < 3) {
            local_2c8._0_8_ = Logger.ChannelName;
            local_2c8._8_4_ = Info;
            std::__cxx11::ostringstream::ostringstream(this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,"Sent advertisement",0x12);
            pOVar4 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_2c8);
            std::__cxx11::ostringstream::~ostringstream(this);
            std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
          }
        }
        else {
          pcVar7 = tonk_result_to_string(result.Result);
          std::__cxx11::string::string((string *)&local_4e8,pcVar7,(allocator *)local_2c8);
          if ((int)Logger.ChannelMinLevel < 5) {
            local_2c8._0_8_ = Logger.ChannelName;
            local_2c8._8_4_ = Error;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,
                       Logger.Prefix._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Advertise failed: ",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_4e8,local_4e0);
            pOVar4 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_2c8);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x80));
          }
          if (local_4e8 != local_4d8) {
            operator_delete(local_4e8);
          }
        }
      }
      if (local_508 != local_4f8) {
        operator_delete(local_508);
      }
    } while (lVar2 != 0);
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = (ostringstream *)(local_4c8 + 0x10);
      local_4c8._0_8_ = Logger.ChannelName;
      local_4c8._8_4_ = Debug;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"...ENTER press detected.  Stopping..",0x24);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_4c8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x80));
    }
  }
  local_140.super_SDKSocket._vptr_SDKSocket = (_func_int **)&PTR__MyClient_0010fa80;
  std::
  vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ::~vector(&local_140.P2PClientList.ConnectionList);
  std::
  vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ::~vector(&local_140.ClientList.ConnectionList);
  tonk::SDKSocket::~SDKSocket(&local_140.super_SDKSocket);
  if ((int)Logger.ChannelMinLevel < 3) {
    poVar1 = (ostringstream *)(local_4c8 + 0x10);
    local_4c8._0_8_ = Logger.ChannelName;
    local_4c8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Test complete.  *** Timing results:",0x23);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_4c8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x80));
  }
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_connect,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_socket_destroy,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_send,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_flush,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_free,1);
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_4c8 + 0x10);
    local_4c8._0_8_ = Logger.ChannelName;
    local_4c8._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Press ENTER key to terminate",0x1c);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_4c8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x80));
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_4c8 + 0x10);
    local_4c8._0_8_ = Logger.ChannelName;
    local_4c8._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"...Key press detected.  Terminating..",0x25);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_4c8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x80));
  }
  pOVar4 = logger::OutputWorker::GetInstance();
  logger::OutputWorker::Flush(pOVar4);
  return 0;
}

Assistant:

int main()
{
    {
        MyClient client;
        if (client.Initialize())
        {
            Logger.Debug("Press SPACE key to stop server. Any other key will send an advertisement broadcast");

            for (;;)
            {
                char cline[512];
                if (!std::cin.getline(cline, sizeof(cline))) {
                    break;
                }
                std::string line = cline;
                if (line.empty()) {
                    break;
                }

                // Send ping
                uint8_t ping[kPongBytes] = {
                    ID_Advertise_Ping, 1, 2, 3, 4
                };
                tonk::SDKResult result = client.Advertise(TONK_BROADCAST, kUDPServerPort_Server, ping, kPongBytes);
                if (result) {
                    Logger.Info("Sent advertisement");
                }
                else
                {
                    TONK_CPP_SDK_DEBUG_BREAK();
                    Logger.Error("Advertise failed: ", result.ToString());
                }
            }

            Logger.Debug("...ENTER press detected.  Stopping..");
        }
    }

    Logger.Info("Test complete.  *** Timing results:");

    t_tonk_connect.Print();
    t_tonk_socket_destroy.Print();
    t_tonk_send.Print();
    t_tonk_flush.Print();
    t_tonk_free.Print();

    Logger.Debug("Press ENTER key to terminate");
    ::getchar();
    Logger.Debug("...Key press detected.  Terminating..");

    logger::Flush();

    return 0;
}